

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# edit_distance.cpp
# Opt level: O1

void __thiscall EditDistance::updateDpPosition(EditDistance *this,int i,int j,int d)

{
  uint uVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  int *piVar6;
  IntView<0> *jVar;
  IntView<0> *iVar;
  
  if (j == 0 && i == 0) {
    return;
  }
  uVar1 = j - 1;
  jVar = this->seq2 + (long)j + -1;
  if (i == 0) {
    iVar5 = getMinimumInsertionCosts(this,jVar);
    piVar6 = (this->dpMatrix).data;
    iVar5 = iVar5 + piVar6[uVar1];
    goto LAB_0016e648;
  }
  iVar2 = i + -1;
  iVar = this->seq1 + (long)i + -1;
  if (j == 0) {
    iVar5 = getMinimumDeletionCosts(this,iVar);
    iVar4 = this->seqSize + 1;
    piVar6 = (this->dpMatrix).data;
    iVar5 = iVar5 + piVar6[(uint)(iVar2 * iVar4)];
    j = iVar4 * i;
    goto LAB_0016e648;
  }
  iVar5 = this->seqSize * this->max_id_cost * 2;
  if (i - d < j) {
    iVar4 = getMinimumInsertionCosts(this,jVar);
    iVar4 = iVar4 + (this->dpMatrix).data[(this->seqSize + 1) * i + uVar1];
    if (iVar4 < iVar5) {
      iVar5 = iVar4;
    }
  }
  if (j < d + i) {
    iVar4 = getMinimumDeletionCosts(this,iVar);
    iVar4 = iVar4 + (this->dpMatrix).data[(uint)((this->seqSize + 1) * iVar2 + j)];
    if (iVar4 < iVar5) {
      iVar5 = iVar4;
    }
  }
  iVar4 = (iVar->var->min).v;
  if (iVar4 == (iVar->var->max).v) {
    iVar3 = (jVar->var->min).v;
    if ((iVar4 != iVar3) || (iVar3 != (jVar->var->max).v)) goto LAB_0016e5e3;
    iVar4 = (this->dpMatrix).data[(this->seqSize + 1) * iVar2 + uVar1];
  }
  else {
LAB_0016e5e3:
    iVar4 = getMinimumSubstitutionCost(this,iVar,jVar);
    iVar4 = iVar4 + (this->dpMatrix).data[(this->seqSize + 1) * iVar2 + uVar1];
  }
  if (iVar4 < iVar5) {
    iVar5 = iVar4;
  }
  j = (this->seqSize + 1) * i + j;
  piVar6 = (this->dpMatrix).data;
LAB_0016e648:
  piVar6[(uint)j] = iVar5;
  return;
}

Assistant:

void updateDpPosition(int i, int j, int d) {
		IntView<>* const iVar = &seq1[i - 1];
		IntView<>* const jVar = &seq2[j - 1];

		if (i == 0 && j == 0) {
			// top left position is always 0
		} else if (i == 0) {
			const int min_insertion_costs = getMinimumInsertionCosts(jVar);
			dpMatrix[matrixCoord(i, j)] = dpMatrix[matrixCoord(0, j - 1)] + min_insertion_costs;
		} else if (j == 0) {
			const int min_deletion_costs = getMinimumDeletionCosts(iVar);
			dpMatrix[matrixCoord(i, j)] = dpMatrix[matrixCoord(i - 1, 0)] + min_deletion_costs;
		} else {
			int minChange = seqSize * 2 * max_id_cost;

			if (j - 1 >= i - d) {
				const int min_insertion_costs = getMinimumInsertionCosts(jVar);
				minChange = std::min(minChange, dpMatrix[matrixCoord(i, j - 1)] + min_insertion_costs);
			}
			if (j < i + d) {
				const int min_deletion_costs = getMinimumDeletionCosts(iVar);
				minChange = std::min(minChange, dpMatrix[matrixCoord(i - 1, j)] + min_deletion_costs);
			}

			if (iVar->isFixed() && jVar->isFixed() && iVar->getVal() == jVar->getVal()) {
				// both values fixed and equal
				minChange = std::min(minChange, dpMatrix[matrixCoord(i - 1, j - 1)]);
			} else {
				const int minDiagonalCost = getMinimumSubstitutionCost(iVar, jVar);
				const int diagonalCost = dpMatrix[matrixCoord(i - 1, j - 1)] + minDiagonalCost;
				minChange = std::min(minChange, diagonalCost);
			}
			dpMatrix[matrixCoord(i, j)] = minChange;
		}
	}